

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amd64.cpp
# Opt level: O2

void stackjit::Amd64Backend::andIntToReg(CodeGen *codeGen,Registers dest,int value,bool is32bits)

{
  undefined3 in_register_00000009;
  Registers *__args;
  size_t i;
  long lVar1;
  IntToBytes converter;
  Registers local_20;
  uchar local_1f [3];
  int local_1c;
  
  if (CONCAT31(in_register_00000009,is32bits) == 0) {
    local_1f[2] = 0x48;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (codeGen,local_1f + 2);
  }
  if (dest == AX) {
    __args = local_1f + 1;
    local_1f[1] = 0x25;
  }
  else {
    local_1f[0] = 0x81;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (codeGen,local_1f);
    local_20 = dest | 0xe0;
    __args = &local_20;
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            (codeGen,__args);
  local_1c = value;
  for (lVar1 = 0; lVar1 != 4; lVar1 = lVar1 + 1) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              (codeGen,(value_type_conflict2 *)((long)&local_1c + lVar1));
  }
  return;
}

Assistant:

void Amd64Backend::andIntToReg(CodeGen& codeGen, Registers dest, int value, bool is32bits) {
		if (!is32bits) {
			codeGen.push_back(0x48);
		}

		if (dest == Registers::AX) {
			codeGen.push_back(0x25);
		} else {
			codeGen.push_back(0x81);
			codeGen.push_back(0xe0 | (Byte)dest);
		}

		IntToBytes converter;
		converter.intValue = value;

		for (std::size_t i = 0; i < sizeof(int); i++) {
			codeGen.push_back(converter.byteValues[i]);
		}
	}